

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int __thiscall
google::protobuf::internal::ExtensionSet::GetEnum(ExtensionSet *this,int number,int default_value)

{
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar1;
  LogMessage *pLVar2;
  CppType *v1_00;
  CppType *v2_00;
  LogMessage local_88;
  Voidify local_71;
  CppType local_70;
  CppType local_6c;
  Nullable<const_char_*> local_68;
  LogMessage local_50;
  Voidify local_39;
  anon_enum_32 local_38;
  anon_enum_32 local_34;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  int default_value_local;
  int number_local;
  ExtensionSet *this_local;
  
  extension._0_4_ = default_value;
  extension._4_4_ = number;
  _default_value_local = this;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)FindOrNull(this,number);
  if (((Extension *)absl_log_internal_check_op_result == (Extension *)0x0) ||
     (((byte)((Extension *)absl_log_internal_check_op_result)->field_0xa >> 1 & 1) != 0)) {
    this_local._4_4_ = (int)extension;
  }
  else {
    local_34 = (anon_enum_32)
               ((((Extension *)absl_log_internal_check_op_result)->is_repeated & 1U) == 0);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_34);
    local_38 = OPTIONAL_FIELD;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_38);
    local_30 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
    if (local_30 != (Nullable<const_char_*>)0x0) {
      pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_30);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1dd,pcVar1);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_50);
    }
    local_6c = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    v1_00 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_6c);
    local_70 = CPPTYPE_ENUM;
    v2_00 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_70);
    local_68 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (v1_00,v2_00,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM")
    ;
    if (local_68 != (Nullable<const_char_*>)0x0) {
      pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_68);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1dd,pcVar1);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_88);
    }
    this_local._4_4_ = *(int *)absl_log_internal_check_op_result;
  }
  return this_local._4_4_;
}

Assistant:

int ExtensionSet::GetEnum(int number, int default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}